

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

Color GetColor(int hexValue)

{
  return (Color)((uint)hexValue >> 0x18 | (hexValue & 0xff0000U) >> 8 | (hexValue & 0xff00U) << 8 |
                hexValue << 0x18);
}

Assistant:

Color GetColor(int hexValue)
{
    Color color;

    color.r = (unsigned char)(hexValue >> 24) & 0xFF;
    color.g = (unsigned char)(hexValue >> 16) & 0xFF;
    color.b = (unsigned char)(hexValue >> 8) & 0xFF;
    color.a = (unsigned char)hexValue & 0xFF;

    return color;
}